

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkJoin.cpp
# Opt level: O0

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> * __thiscall
dg::ForkJoinAnalysis::matchJoin(ForkJoinAnalysis *this,Value *joinVal)

{
  bool bVar1;
  LLVMPointerAnalysisOptions *this_00;
  reference ppPVar2;
  PSNode *pPVar3;
  raw_ostream *in_RSI;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *in_RDI;
  Value *llvmcall;
  PSNodeFork *forkNode;
  iterator __end1;
  iterator __begin1;
  set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
  *__range1;
  PSNodeJoin *joinNode;
  CallInst *joinCall;
  LLVMPointerGraphBuilder *builder;
  DGLLVMPointerAnalysis *dgPTA;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *threads;
  PSNodeJoin *in_stack_ffffffffffffff48;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__x;
  _Self local_88;
  _Self local_80;
  undefined1 local_78 [48];
  undefined1 *local_48;
  undefined8 local_40;
  ret_type local_38;
  CallInst *local_30;
  undefined1 local_21;
  undefined8 local_20;
  
  __x = in_RDI;
  this_00 = LLVMPointerAnalysis::getOptions(*(LLVMPointerAnalysis **)in_RSI);
  bVar1 = LLVMPointerAnalysisOptions::isSVF(this_00);
  if (bVar1) {
    llvm::errs();
    llvm::raw_ostream::operator<<(in_RSI,(char *)__x);
    abort();
  }
  local_20 = *(undefined8 *)in_RSI;
  local_21 = 0;
  std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
            ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)0x1b3b3a);
  local_30 = (CallInst *)DGLLVMPointerAnalysis::getBuilder((DGLLVMPointerAnalysis *)0x1b3b47);
  local_38 = llvm::cast<llvm::CallInst,llvm::Value_const>((Value *)0x1b3b5c);
  local_40 = dg::pta::LLVMPointerGraphBuilder::findJoin(local_30);
  pta::PSNodeJoin::forks(in_stack_ffffffffffffff48);
  local_48 = local_78;
  local_80._M_node =
       (_Base_ptr)
       std::
       set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
       ::begin((set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
                *)in_stack_ffffffffffffff48);
  local_88._M_node =
       (_Base_ptr)
       std::
       set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
       ::end((set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
              *)in_stack_ffffffffffffff48);
  while (bVar1 = std::operator!=(&local_80,&local_88), bVar1) {
    ppPVar2 = std::_Rb_tree_const_iterator<dg::pta::PSNodeFork_*>::operator*
                        ((_Rb_tree_const_iterator<dg::pta::PSNodeFork_*> *)0x1b3bde);
    pPVar3 = pta::PSNodeFork::callInst(*ppPVar2);
    SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
              ((SubgraphNode<dg::pta::PSNode> *)(pPVar3 + 8));
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::push_back
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)in_RSI,
               (value_type *)__x);
    std::_Rb_tree_const_iterator<dg::pta::PSNodeFork_*>::operator++
              ((_Rb_tree_const_iterator<dg::pta::PSNodeFork_*> *)in_RDI);
  }
  std::
  set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
  ::~set((set<dg::pta::PSNodeFork_*,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
          *)0x1b3bd2);
  return __x;
}

Assistant:

std::vector<const llvm::Value *>
ForkJoinAnalysis::matchJoin(const llvm::Value *joinVal) {
    using namespace llvm;

    if (_PTA->getOptions().isSVF()) {
        errs() << "ForkJoin analysis does not support SVF yet\n";
        abort();
    }

    auto *dgPTA = static_cast<DGLLVMPointerAnalysis *>(_PTA);
    std::vector<const llvm::Value *> threads;

    auto *const builder = dgPTA->getBuilder();
    const auto *const joinCall = cast<CallInst>(joinVal);
    auto *const joinNode = builder->findJoin(joinCall);
    for (auto *const forkNode : joinNode->forks()) {
        auto *const llvmcall = forkNode->callInst()->getUserData<llvm::Value>();
        assert(isa<CallInst>(llvmcall));
        threads.push_back(llvmcall);
    }

    return threads;

    // const auto calledVal = joinCall->getCalledValue();
    // if (const auto joinF = dyn_cast<Function>(calledVal)) {
    //    assert(joinF->getName().equals("pthread_join")
    //            && "Invalid function taken as pthread join");

    //} else {
    //    errs() << "Join via function call not implemented yet\n";
    //    abort();
    //}
}